

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Scan_add64(int g_a,int g_b,int g_sbit,int64_t lo,int64_t hi,int excl)

{
  Integer ahi;
  Integer alo;
  Integer x;
  Integer s;
  Integer b;
  Integer a;
  Integer in_stack_00001378;
  Integer in_stack_00001380;
  Integer in_stack_00001388;
  Integer in_stack_00001390;
  Integer in_stack_00001398;
  Integer in_stack_000013a0;
  
  pnga_scan_add(in_stack_000013a0,in_stack_00001398,in_stack_00001390,in_stack_00001388,
                in_stack_00001380,in_stack_00001378);
  return;
}

Assistant:

void GA_Scan_add64(int g_a, int g_b, int g_sbit, int64_t lo,
                 int64_t hi, int excl)
{
     Integer a = (Integer)g_a;
     Integer b = (Integer)g_b;
     Integer s = (Integer)g_sbit;
     Integer x = (Integer)excl;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_scan_add(a, b, s, alo, ahi, x);

}